

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::VarintTest_TestReadString_Test::~VarintTest_TestReadString_Test
          (VarintTest_TestReadString_Test *this)

{
  VarintTest_TestReadString_Test *this_local;
  
  ~VarintTest_TestReadString_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VarintTest, TestReadString)
{
    ByteBuffer buffer_null = BufferUtil::StringAsBuffer(std::string("\000", 1));
    ByteBuffer buffer_empty = BufferUtil::StringAsBuffer("\001");
    ByteBuffer buffer_X = BufferUtil::StringAsBuffer("\002X");
    ByteBuffer buffer_test = BufferUtil::StringAsBuffer("\005test");
    ByteBuffer buffer_hello_world = BufferUtil::StringAsBuffer("\014hello world");

    EXPECT_EQ(Varint::kNullString, Varint::ReadString(buffer_null));
    EXPECT_EQ("", Varint::ReadString(buffer_empty));
    EXPECT_EQ("X", Varint::ReadString(buffer_X));
    EXPECT_EQ("test", Varint::ReadString(buffer_test));
    EXPECT_EQ("hello world", Varint::ReadString(buffer_hello_world));
}